

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_unique_ptr.cpp
# Opt level: O3

void __thiscall TestA::TestA(TestA *this)

{
  (this->m_TestB_Ptr).super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_TestB_Ptr).super___shared_ptr<TestB,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TestA()",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  return;
}

Assistant:

TestA()
	{
		std::cout << "TestA()" << std::endl;
	}